

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_initDStream(ZSTD_DStream *zds)

{
  zds->streamStage = zdss_init;
  zds->noForwardProgress = 0;
  ZSTD_freeDDict(zds->ddictLocal);
  zds->dictUses = ZSTD_dont_use;
  zds->ddictLocal = (ZSTD_DDict *)0x0;
  zds->ddict = (ZSTD_DDict *)0x0;
  if (zds->format < 2) {
    return (ulong)(zds->format == ZSTD_f_zstd1) * 4 + 1;
  }
  __assert_fail("(format == ZSTD_f_zstd1) || (format == ZSTD_f_zstd1_magicless)",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                ,0x9c36,"size_t ZSTD_startingInputLength(ZSTD_format_e)");
}

Assistant:

size_t ZSTD_initDStream(ZSTD_DStream* zds)
{
    DEBUGLOG(4, "ZSTD_initDStream");
    FORWARD_IF_ERROR(ZSTD_DCtx_reset(zds, ZSTD_reset_session_only), "");
    FORWARD_IF_ERROR(ZSTD_DCtx_refDDict(zds, NULL), "");
    return ZSTD_startingInputLength(zds->format);
}